

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

mecab_learner_node_t * __thiscall
MeCab::Tokenizer<mecab_learner_node_t,_mecab_learner_path_t>::getBOSNode
          (Tokenizer<mecab_learner_node_t,_mecab_learner_path_t> *this,
          Allocator<mecab_learner_node_t,_mecab_learner_path_t> *allocator)

{
  mecab_learner_node_t *pmVar1;
  char *pcVar2;
  Allocator<mecab_learner_node_t,_mecab_learner_path_t> *in_RDI;
  mecab_learner_node_t *bos_node;
  
  pmVar1 = Allocator<mecab_learner_node_t,_mecab_learner_path_t>::newNode(in_RDI);
  pmVar1->surface = "BOS/EOS";
  pcVar2 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x280));
  pmVar1->feature = pcVar2;
  pmVar1->isbest = '\x01';
  pmVar1->stat = '\x02';
  return pmVar1;
}

Assistant:

N *Tokenizer<N, P>::getBOSNode(Allocator<N, P> *allocator) const {
  N *bos_node = allocator->newNode();
  bos_node->surface = const_cast<const char *>(BOS_KEY);  // dummy
  bos_node->feature = bos_feature_.get();
  bos_node->isbest = 1;
  bos_node->stat = MECAB_BOS_NODE;
  return bos_node;
}